

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O0

void convsamp_float(JSAMPARRAY sample_data,JDIMENSION start_col,float *workspace)

{
  byte *pbVar1;
  float *pfVar2;
  int elemr;
  JSAMPROW elemptr;
  float *workspaceptr;
  float *workspace_local;
  JDIMENSION start_col_local;
  JSAMPARRAY sample_data_local;
  
  workspaceptr = workspace;
  for (elemr = 0; elemr < 8; elemr = elemr + 1) {
    pbVar1 = sample_data[elemr] + start_col;
    *workspaceptr = (float)(int)(*pbVar1 - 0x80);
    workspaceptr[1] = (float)(int)(pbVar1[1] - 0x80);
    workspaceptr[2] = (float)(int)(pbVar1[2] - 0x80);
    workspaceptr[3] = (float)(int)(pbVar1[3] - 0x80);
    workspaceptr[4] = (float)(int)(pbVar1[4] - 0x80);
    workspaceptr[5] = (float)(int)(pbVar1[5] - 0x80);
    pfVar2 = workspaceptr + 7;
    workspaceptr[6] = (float)(int)(pbVar1[6] - 0x80);
    workspaceptr = workspaceptr + 8;
    *pfVar2 = (float)(int)(pbVar1[7] - 0x80);
  }
  return;
}

Assistant:

METHODDEF(void)
convsamp_float(JSAMPARRAY sample_data, JDIMENSION start_col,
               FAST_FLOAT *workspace)
{
  register FAST_FLOAT *workspaceptr;
  register JSAMPROW elemptr;
  register int elemr;

  workspaceptr = workspace;
  for (elemr = 0; elemr < DCTSIZE; elemr++) {
    elemptr = sample_data[elemr] + start_col;
#if DCTSIZE == 8                /* unroll the inner loop */
    *workspaceptr++ = (FAST_FLOAT)((*elemptr++) - CENTERJSAMPLE);
    *workspaceptr++ = (FAST_FLOAT)((*elemptr++) - CENTERJSAMPLE);
    *workspaceptr++ = (FAST_FLOAT)((*elemptr++) - CENTERJSAMPLE);
    *workspaceptr++ = (FAST_FLOAT)((*elemptr++) - CENTERJSAMPLE);
    *workspaceptr++ = (FAST_FLOAT)((*elemptr++) - CENTERJSAMPLE);
    *workspaceptr++ = (FAST_FLOAT)((*elemptr++) - CENTERJSAMPLE);
    *workspaceptr++ = (FAST_FLOAT)((*elemptr++) - CENTERJSAMPLE);
    *workspaceptr++ = (FAST_FLOAT)((*elemptr++) - CENTERJSAMPLE);
#else
    {
      register int elemc;
      for (elemc = DCTSIZE; elemc > 0; elemc--)
        *workspaceptr++ = (FAST_FLOAT)((*elemptr++) - CENTERJSAMPLE);
    }
#endif
  }
}